

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

uchar ComputeChecksumRPLIDAR(uchar *req,int reqlen)

{
  byte local_19;
  int local_18;
  uchar res;
  int i;
  int reqlen_local;
  uchar *req_local;
  
  local_19 = 0;
  for (local_18 = 0; local_18 < reqlen + -1; local_18 = local_18 + 1) {
    local_19 = local_19 ^ req[local_18];
  }
  return local_19;
}

Assistant:

inline unsigned char ComputeChecksumRPLIDAR(unsigned char* req, int reqlen)
{
	int i = 0;
	unsigned char res = 0;

	while (i < reqlen-NB_BYTES_CHECKSUM_RPLIDAR)
	{
		res ^= req[i];
		i++;
	}
	return res;
}